

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.cpp
# Opt level: O3

BarcodeMatrix * __thiscall
ZXing::Pdf417::Encoder::generateBarcodeLogic
          (BarcodeMatrix *__return_storage_ptr__,Encoder *this,wstring *msg,int errorCorrectionLevel
          )

{
  short sVar1;
  short *psVar2;
  void *pvVar3;
  bool bVar4;
  Encoder *pEVar5;
  long lVar6;
  invalid_argument *piVar7;
  int iVar8;
  undefined4 in_register_0000000c;
  int iVar9;
  uint uVar10;
  int iVar11;
  CharacterSet in_R8B;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong unaff_R13;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  EVP_PKEY_CTX *pEVar20;
  float fVar22;
  float fVar23;
  vector<int,_std::allocator<int>_> dataCodewords;
  int n;
  vector<int,_std::allocator<int>_> e;
  vector<int,_std::allocator<int>_> highLevel;
  vector<int,_std::allocator<int>_> local_d8;
  EVP_PKEY_CTX *local_b8;
  ulong local_b0;
  int local_a4;
  Encoder *local_a0;
  pointer local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  ulong local_48;
  uint *local_40;
  undefined8 local_38;
  ulong uVar21;
  
  local_b0 = CONCAT44(in_register_0000000c,errorCorrectionLevel);
  if (8 < (uint)errorCorrectionLevel) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar7,"Error correction level must be between 0 and 8!");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar13 = 2 << ((byte)errorCorrectionLevel & 0x1f);
  uVar16 = (ulong)uVar13;
  HighLevelEncoder::EncodeHighLevel
            (&local_60,(HighLevelEncoder *)msg,(wstring *)(ulong)this->_compaction,
             (uint)this->_encoding,in_R8B);
  uVar10 = this->_minCols;
  uVar18 = this->_minRows;
  uVar19 = (uint)((ulong)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
  iVar8 = uVar19 + uVar13 + 1;
  local_a0 = this;
  if ((int)uVar10 <= this->_maxCols) {
    local_b8 = (EVP_PKEY_CTX *)(ulong)(uVar10 * 0x10);
    iVar11 = uVar10 * 0x11 + 0x45;
    fVar22 = 0.0;
    bVar4 = false;
    uVar15 = uVar10;
    do {
      uVar17 = (int)((long)iVar8 / (long)(int)uVar15) + 1;
      pEVar20 = (EVP_PKEY_CTX *)(ulong)uVar17;
      if ((int)(iVar8 + uVar15) <= (int)(uVar17 * uVar15)) {
        pEVar20 = (EVP_PKEY_CTX *)((long)iVar8 / (long)(int)uVar15 & 0xffffffff);
      }
      iVar9 = (int)pEVar20;
      if (iVar9 < (int)uVar18) break;
      if (iVar9 <= this->_maxRows) {
        fVar23 = (float)(iVar11 / iVar9) * 0.25;
        if ((!bVar4) || (ABS(fVar23 + -3.0) <= ABS(fVar22 + -3.0))) {
          bVar4 = true;
          unaff_R13 = (ulong)uVar15;
          fVar22 = fVar23;
          local_b8 = pEVar20;
        }
      }
      uVar15 = uVar15 + 1;
      iVar11 = iVar11 + 0x11;
    } while (this->_maxCols + 1U != uVar15);
    pEVar20 = local_b8;
    if (bVar4) goto LAB_0017adad;
  }
  iVar11 = iVar8 / (int)uVar10 + 1;
  if ((int)(iVar8 + uVar10) <= (int)(iVar11 * uVar10)) {
    iVar11 = iVar8 / (int)uVar10;
  }
  unaff_R13 = (ulong)uVar10;
  pEVar20 = (EVP_PKEY_CTX *)(ulong)uVar18;
  if ((int)uVar18 <= iVar11) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Unable to fit message in columns");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
LAB_0017adad:
  iVar9 = (int)pEVar20;
  iVar11 = (int)unaff_R13 * iVar9 - uVar13;
  iVar8 = 0;
  if ((int)(uVar19 + 1) < iVar11) {
    iVar8 = ~uVar19 + iVar11;
  }
  local_88 = unaff_R13;
  if ((int)(uVar13 + uVar19) < 0x3a1) {
    local_a4 = uVar19 + 1 + iVar8;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    std::vector<int,_std::allocator<int>_>::reserve(&local_d8,(long)local_a4);
    if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_d8,
                 (iterator)
                 local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_a4);
    }
    else {
      *local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_a4;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((vector<int,std::allocator<int>> *)&local_d8,
               local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    if (0 < iVar8) {
      iVar11 = 0;
      do {
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 900;
        if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_d8,
                     (iterator)
                     local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_78);
        }
        else {
          *local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 900;
          local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar8);
    }
    local_38 = (pointer)((ulong)local_38._4_4_ << 0x20);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_78,uVar16,(value_type_conflict3 *)&local_38,(allocator_type *)&local_40);
    local_98 = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_90 = (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_40 = (uint *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
    uVar10 = (uint)(local_90 >> 2);
    if (0 < (int)uVar10) {
      psVar2 = *(short **)(EC_COEFFICIENTS + (local_b0 & 0xffffffff) * 8);
      sVar1 = *psVar2;
      uVar12 = 0;
      do {
        iVar8 = (int)(local_40[uVar16 - 1] +
                     local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12]) % 0x3a1;
        uVar14 = (ulong)(uVar13 - 1);
        uVar21 = uVar16;
        do {
          iVar11 = psVar2[uVar14] * iVar8;
          local_40[uVar14] =
               (int)(((iVar11 / 0x3a1) * 0x3a1 - iVar11) + local_40[uVar14 - 1] + 0x3a1) % 0x3a1;
          uVar14 = uVar14 - 1;
          uVar18 = (int)uVar21 - 1;
          uVar21 = (ulong)uVar18;
        } while (1 < (int)uVar18);
        iVar8 = (iVar8 * sVar1) % 0x3a1;
        uVar19 = 0x3a1 - iVar8;
        uVar18 = -iVar8;
        if (uVar19 < 0x3a1) {
          uVar18 = uVar19;
        }
        *local_40 = uVar18;
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uVar10 & 0x7fffffff));
    }
    uVar12 = 0;
    do {
      if (local_40[uVar12] != 0) {
        local_40[uVar12] = 0x3a1 - local_40[uVar12];
      }
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
    local_38 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_b8 = pEVar20;
    std::vector<int,std::allocator<int>>::
    _M_range_insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
              ((vector<int,std::allocator<int>> *)&local_d8,
               (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + local_90);
    pEVar5 = local_a0;
    pvVar3 = (void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
    }
    local_90 = CONCAT71(local_90._1_7_,pEVar5->_compact);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_matrix).
             super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_matrix).
             super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    (__return_storage_ptr__->_matrix).
    super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->_matrix).
    super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->_currentRow = -1;
    BarcodeMatrix::init(__return_storage_ptr__,pEVar20);
    if (0 < iVar9) {
      uVar16 = (ulong)(iVar9 - 1U) / 3;
      local_80 = (ulong)((iVar9 - 1U) % 3 + (int)local_b0 * 3);
      iVar8 = (int)local_88;
      local_b0 = CONCAT44(local_b0._4_4_,iVar8 + -1);
      uVar10 = 0;
      local_a0 = (Encoder *)((ulong)local_a0 & 0xffffffff00000000);
      local_48 = uVar16;
      do {
        lVar6 = (long)__return_storage_ptr__->_currentRow + 1;
        __return_storage_ptr__->_currentRow = (int)lVar6;
        EncodeChar(0x1fea8,0x11,
                   (__return_storage_ptr__->_matrix).
                   super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar6);
        uVar18 = uVar10 % 3;
        iVar11 = (int)local_b0;
        iVar9 = (int)uVar16;
        if ((uVar18 != 0) && (iVar11 = (int)uVar16, iVar9 = (int)local_80, uVar18 != 1)) {
          iVar11 = (int)local_80;
          iVar9 = (int)local_b0;
        }
        local_98 = (pointer)CONCAT44(local_98._4_4_,iVar11);
        iVar11 = (uVar10 / 3) * 0x20 + (uVar10 / 3) * -2;
        EncodeChar(*(int *)(CODEWORD_TABLE + (long)(iVar9 + iVar11) * 4 + (ulong)uVar18 * 0xe84),
                   0x11,(__return_storage_ptr__->_matrix).
                        super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        __return_storage_ptr__->_currentRow);
        if (0 < (int)local_88) {
          lVar6 = (long)(int)local_a0;
          iVar9 = 0;
          do {
            EncodeChar(*(int *)(CODEWORD_TABLE +
                               (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar6] * 4 +
                               (ulong)uVar18 * 0xe84),0x11,
                       (__return_storage_ptr__->_matrix).
                       super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       __return_storage_ptr__->_currentRow);
            lVar6 = lVar6 + 1;
            iVar9 = iVar9 + -1;
          } while (-iVar8 != iVar9);
          local_a0 = (Encoder *)CONCAT44(local_a0._4_4_,(int)local_a0 - iVar9);
          uVar16 = local_48;
        }
        iVar9 = 1;
        if ((char)local_90 == '\0') {
          iVar9 = 0x12;
          EncodeChar(*(int *)(CODEWORD_TABLE +
                             (long)(iVar11 + (int)local_98) * 4 + (ulong)uVar18 * 0xe84),0x11,
                     (__return_storage_ptr__->_matrix).
                     super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                     ._M_impl.super__Vector_impl_data._M_start + __return_storage_ptr__->_currentRow
                    );
        }
        EncodeChar(0x3fa29,iVar9,
                   (__return_storage_ptr__->_matrix).
                   super__Vector_base<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>
                   ._M_impl.super__Vector_impl_data._M_start + __return_storage_ptr__->_currentRow);
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)local_b8);
    }
    if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar7,"Encoded message contains to many code words, message too big");
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BarcodeMatrix
Encoder::generateBarcodeLogic(const std::wstring& msg, int errorCorrectionLevel) const
{
	if (errorCorrectionLevel < 0 || errorCorrectionLevel > 8) {
		throw std::invalid_argument("Error correction level must be between 0 and 8!");
	}

	//1. step: High-level encoding
	int errorCorrectionCodeWords = GetErrorCorrectionCodewordCount(errorCorrectionLevel);
	std::vector<int> highLevel = HighLevelEncoder::EncodeHighLevel(msg, _compaction, _encoding);
	
	int sourceCodeWords = Size(highLevel);

	int cols, rows;
	DetermineDimensions(_minCols, _maxCols, _minRows, _maxRows, sourceCodeWords, errorCorrectionCodeWords, cols, rows);

	int pad = GetNumberOfPadCodewords(sourceCodeWords, errorCorrectionCodeWords, cols, rows);

	//2. step: construct data codewords
	if (sourceCodeWords + errorCorrectionCodeWords + 1 > 929) { // +1 for symbol length CW
		throw std::invalid_argument("Encoded message contains to many code words, message too big");
	}
	int n = sourceCodeWords + pad + 1;
	std::vector<int> dataCodewords;
	dataCodewords.reserve(n);
	dataCodewords.push_back(n);
	dataCodewords.insert(dataCodewords.end(), highLevel.begin(), highLevel.end());
	for (int i = 0; i < pad; i++) {
		dataCodewords.push_back(900); //PAD characters
	}

	//3. step: Error correction
	GenerateErrorCorrection(dataCodewords, errorCorrectionLevel);

	//4. step: low-level encoding
	return EncodeLowLevel(dataCodewords, cols, rows, errorCorrectionLevel, _compact);
}